

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_internal.h
# Opt level: O2

int scalar_register(MOJOSHADER_shaderType shader_type,RegisterType regtype,int regnum)

{
  bool bVar1;
  
  bVar1 = true;
  switch(regtype) {
  case REG_TYPE_DEPTHOUT:
  case REG_TYPE_CONSTBOOL:
  case REG_TYPE_LOOP:
    break;
  case REG_TYPE_MISCTYPE:
    bVar1 = regnum == 1;
    break;
  case REG_TYPE_MAX:
    bVar1 = shader_type == MOJOSHADER_TYPE_PIXEL;
    break;
  default:
    if (regtype == REG_TYPE_RASTOUT) {
      bVar1 = regnum - 1U < 2;
      break;
    }
  case REG_TYPE_SAMPLER:
  case REG_TYPE_CONST2:
  case REG_TYPE_CONST3:
  case REG_TYPE_CONST4:
  case REG_TYPE_TEMPFLOAT16:
  case REG_TYPE_LABEL:
    bVar1 = false;
  }
  return (int)bVar1;
}

Assistant:

static inline int scalar_register(const MOJOSHADER_shaderType shader_type,
                                  const RegisterType regtype, const int regnum)
{
    switch (regtype)
    {
        case REG_TYPE_RASTOUT:
            if (((const RastOutType) regnum) == RASTOUT_TYPE_FOG)
                return 1;
            else if (((const RastOutType) regnum) == RASTOUT_TYPE_POINT_SIZE)
                return 1;
            return 0;

        case REG_TYPE_DEPTHOUT:
        case REG_TYPE_CONSTBOOL:
        case REG_TYPE_LOOP:
            return 1;

        case REG_TYPE_MISCTYPE:
            if ( ((const MiscTypeType) regnum) == MISCTYPE_TYPE_FACE )
                return 1;
            return 0;

        case REG_TYPE_PREDICATE:
            return (shader_type == MOJOSHADER_TYPE_PIXEL) ? 1 : 0;

        default: break;
    } // switch

    return 0;
}